

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O0

bool __thiscall TestState::Serialize(TestState *this,CBB *cbb)

{
  bool bVar1;
  int iVar2;
  pointer in;
  uint8_t *data;
  size_t len;
  undefined1 local_b0 [8];
  CBB text;
  CBB pending;
  CBB out;
  CBB *cbb_local;
  TestState *this_local;
  
  iVar2 = CBB_add_u24_length_prefixed(cbb,(CBB *)((long)&pending.u + 0x18));
  if (((iVar2 != 0) && (iVar2 = CBB_add_u16((CBB *)((long)&pending.u + 0x18),0), iVar2 != 0)) &&
     (iVar2 = CBB_add_u24_length_prefixed
                        ((CBB *)((long)&pending.u + 0x18),(CBB *)((long)&text.u + 0x18)), iVar2 != 0
     )) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pending_session);
    if (bVar1) {
      in = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&this->pending_session);
      bVar1 = bssl::ssl_session_serialize(in,(CBB *)((long)&text.u + 0x18));
      if (!bVar1) {
        return false;
      }
    }
    iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&pending.u + 0x18),(CBB *)local_b0);
    if (iVar2 != 0) {
      data = (uint8_t *)std::__cxx11::string::data();
      len = std::__cxx11::string::length();
      iVar2 = CBB_add_bytes((CBB *)local_b0,data,len);
      if (((iVar2 != 0) &&
          (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&pending.u + 0x18),g_clock.tv_sec), iVar2 != 0)
          ) && ((iVar2 = CBB_add_asn1_uint64((CBB *)((long)&pending.u + 0x18),g_clock.tv_usec),
                iVar2 != 0 && (iVar2 = CBB_flush(cbb), iVar2 != 0)))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool TestState::Serialize(CBB *cbb) const {
  CBB out, pending, text;
  if (!CBB_add_u24_length_prefixed(cbb, &out) ||
      !CBB_add_u16(&out, 0 /* version */) ||
      !CBB_add_u24_length_prefixed(&out, &pending) ||
      (pending_session &&
       !ssl_session_serialize(pending_session.get(), &pending)) ||
      !CBB_add_u16_length_prefixed(&out, &text) ||
      !CBB_add_bytes(
          &text, reinterpret_cast<const uint8_t *>(msg_callback_text.data()),
          msg_callback_text.length()) ||
      !CBB_add_asn1_uint64(&out, g_clock.tv_sec) ||
      !CBB_add_asn1_uint64(&out, g_clock.tv_usec) ||
      !CBB_flush(cbb)) {
    return false;
  }
  return true;
}